

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isupper.c
# Opt level: O0

int main(void)

{
  int iVar1;
  
  iVar1 = isupper(0x41);
  if (iVar1 == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isupper.c, line %d - %s\n"
           ,0x1a,"isupper( \'A\' )");
  }
  iVar1 = isupper(0x5a);
  if (iVar1 == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isupper.c, line %d - %s\n"
           ,0x1b,"isupper( \'Z\' )");
  }
  iVar1 = isupper(0x61);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isupper.c, line %d - %s\n"
           ,0x1c,"! isupper( \'a\' )");
  }
  iVar1 = isupper(0x7a);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isupper.c, line %d - %s\n"
           ,0x1d,"! isupper( \'z\' )");
  }
  iVar1 = isupper(0x20);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isupper.c, line %d - %s\n"
           ,0x1e,"! isupper( \' \' )");
  }
  iVar1 = isupper(0x40);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isupper.c, line %d - %s\n"
           ,0x1f,"! isupper( \'@\' )");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    TESTCASE( isupper( 'A' ) );
    TESTCASE( isupper( 'Z' ) );
    TESTCASE( ! isupper( 'a' ) );
    TESTCASE( ! isupper( 'z' ) );
    TESTCASE( ! isupper( ' ' ) );
    TESTCASE( ! isupper( '@' ) );
    return TEST_RESULTS;
}